

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Gc::resumeTheWorld(Gc *this)

{
  size_t sVar1;
  unsigned_long *puVar2;
  void *__stat_loc;
  long in_RDI;
  size_t i;
  Mapping *in_stack_fffffffffffffff0;
  Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this_00;
  
  __stat_loc = (void *)0x3;
  axl::io::psx::Mapping::protect(in_stack_fffffffffffffff0,(int)((ulong)in_RDI >> 0x20));
  *(undefined4 *)(in_RDI + 0x68) = 2;
  sVar1 = axl::sl::ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::getCount
                    ((ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)
                     (in_RDI + 0x10));
  *(int *)(in_RDI + 0x6c) = (int)sVar1;
  for (this_00 = (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)0x0;
      this_00 < (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)
                (long)*(int *)(in_RDI + 0x6c);
      this_00 = (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)
                ((long)&(this_00->
                        super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p +
                1)) {
    puVar2 = axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::operator[]
                       (this_00,in_RDI);
    __stat_loc = (void *)0xa;
    pthread_kill(*puVar2,10);
  }
  axl::sys::psx::Sem::wait((Sem *)(in_RDI + 0x70),__stat_loc);
  *(undefined4 *)(in_RDI + 0x68) = 0;
  return;
}

Assistant:

void
	resumeTheWorld() {
		m_guardPage.protect(PROT_READ | PROT_WRITE);

		m_handshakeKind = HandshakeKind_ResumeTheWorld;
		m_handshakeCounter = m_threadArray.getCount();
		for (size_t i = 0; i < m_handshakeCounter; i++)
			pthread_kill((pthread_t)m_threadArray[i], SIGUSR1); // resume

		m_handshakeSem.wait();
		m_handshakeKind = HandshakeKind_None;
	}